

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServiceRequestPdu.cpp
# Opt level: O2

bool __thiscall DIS::ServiceRequestPdu::operator==(ServiceRequestPdu *this,ServiceRequestPdu *rhs)

{
  pointer pSVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  size_t idx;
  ulong uVar5;
  long lVar6;
  
  bVar2 = LogisticsFamilyPdu::operator==
                    (&this->super_LogisticsFamilyPdu,&rhs->super_LogisticsFamilyPdu);
  bVar3 = EntityID::operator==(&this->_requestingEntityID,&rhs->_requestingEntityID);
  bVar4 = EntityID::operator==(&this->_servicingEntityID,&rhs->_servicingEntityID);
  bVar2 = this->_serviceRequestPadding == rhs->_serviceRequestPadding &&
          (this->_serviceTypeRequested == rhs->_serviceTypeRequested && (bVar4 && (bVar3 && bVar2)))
  ;
  lVar6 = 0;
  for (uVar5 = 0;
      pSVar1 = (this->_supplies).
               super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl
               .super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_supplies).
                            super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 5);
      uVar5 = uVar5 + 1) {
    bVar3 = SupplyQuantity::operator==
                      ((SupplyQuantity *)((long)&pSVar1->_vptr_SupplyQuantity + lVar6),
                       (SupplyQuantity *)
                       ((long)&((rhs->_supplies).
                                super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_SupplyQuantity +
                       lVar6));
    bVar2 = (bool)(bVar2 & bVar3);
    lVar6 = lVar6 + 0x20;
  }
  return bVar2;
}

Assistant:

bool ServiceRequestPdu::operator ==(const ServiceRequestPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = LogisticsFamilyPdu::operator==(rhs);

     if( ! (_requestingEntityID == rhs._requestingEntityID) ) ivarsEqual = false;
     if( ! (_servicingEntityID == rhs._servicingEntityID) ) ivarsEqual = false;
     if( ! (_serviceTypeRequested == rhs._serviceTypeRequested) ) ivarsEqual = false;
     if( ! (_serviceRequestPadding == rhs._serviceRequestPadding) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _supplies.size(); idx++)
     {
        if( ! ( _supplies[idx] == rhs._supplies[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }